

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

int AF_AActor_GetSpriteIndex
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int val;
  char *__assertion;
  int iVar1;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\0') {
      iVar1 = 0;
      val = GetSpriteIndex(FName::NameData.NameArray[(param->field_0).i].Text,false);
      if (0 < numret) {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/info.cpp"
                        ,0xb0,
                        "int AF_AActor_GetSpriteIndex(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,val);
        iVar1 = 1;
      }
      return iVar1;
    }
    __assertion = "param[paramnum].Type == REGT_INT";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/info.cpp"
                ,0xaf,
                "int AF_AActor_GetSpriteIndex(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GetSpriteIndex)
{
	PARAM_PROLOGUE;
	PARAM_NAME(sprt);
	ACTION_RETURN_INT(GetSpriteIndex(sprt.GetChars(), false));
}